

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O2

int format_number(int64_t v,char *p,int s,int maxsize,int strict)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (strict == 0) {
    uVar2 = (ulong)(uint)maxsize;
    if (-1 < v) {
      lVar3 = 1L << ((char)s * '\x03' & 0x3fU);
      for (; s <= maxsize; s = s + 1) {
        if (v < lVar3) goto LAB_004ceb0f;
        lVar3 = lVar3 << 3;
      }
    }
    for (; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      p[uVar2 - 1] = (char)v;
      v = v >> 8;
    }
    p[uVar2] = p[uVar2] | 0x80;
    return 0;
  }
LAB_004ceb0f:
  iVar1 = format_octal(v,p,s);
  return iVar1;
}

Assistant:

static int
format_number(int64_t v, char *p, int s, int maxsize, int strict)
{
	int64_t limit;

	limit = ((int64_t)1 << (s*3));

	/* "Strict" only permits octal values with proper termination. */
	if (strict)
		return (format_octal(v, p, s));

	/*
	 * In non-strict mode, we allow the number to overwrite one or
	 * more bytes of the field termination.  Even old tar
	 * implementations should be able to handle this with no
	 * problem.
	 */
	if (v >= 0) {
		while (s <= maxsize) {
			if (v < limit)
				return (format_octal(v, p, s));
			s++;
			limit <<= 3;
		}
	}

	/* Base-256 can handle any number, positive or negative. */
	return (format_256(v, p, maxsize));
}